

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Show(Abc_Frame_t *pAbc,int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *vBold;
  int *piVar3;
  Gia_Man_t *pGVar4;
  uint fAdders;
  char *pcVar5;
  long lVar6;
  
  fAdders = 0;
  Extra_UtilGetoptReset();
  while (iVar2 = Extra_UtilGetopt(argc,argv,"ah"), iVar2 == 0x61) {
    fAdders = fAdders ^ 1;
  }
  if (iVar2 == -1) {
    pGVar4 = pAbc->pGia;
    if (pGVar4 == (Gia_Man_t *)0x0) {
      pcVar5 = "Abc_CommandAbc9Show(): There is no AIG.\n";
    }
    else {
      if (pGVar4->nBufs == 0) {
        if ((fAdders == 0) && (pGVar4->vMapping != (Vec_Int_t *)0x0)) {
          vBold = (Vec_Int_t *)malloc(0x10);
          vBold->nCap = 100;
          vBold->nSize = 0;
          piVar3 = (int *)malloc(400);
          vBold->pArray = piVar3;
          pGVar4 = pAbc->pGia;
          if (1 < pGVar4->nObjs) {
            lVar6 = 1;
            do {
              if (pGVar4->vMapping->nSize <= lVar6) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                              ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              if (pGVar4->vMapping->pArray[lVar6] != 0) {
                uVar1 = vBold->nCap;
                if (vBold->nSize == uVar1) {
                  if ((int)uVar1 < 0x10) {
                    if (vBold->pArray == (int *)0x0) {
                      piVar3 = (int *)malloc(0x40);
                    }
                    else {
                      piVar3 = (int *)realloc(vBold->pArray,0x40);
                    }
                    vBold->pArray = piVar3;
                    iVar2 = 0x10;
                  }
                  else {
                    iVar2 = uVar1 * 2;
                    if (iVar2 <= (int)uVar1) goto LAB_00226ce8;
                    if (vBold->pArray == (int *)0x0) {
                      piVar3 = (int *)malloc((ulong)uVar1 << 3);
                    }
                    else {
                      piVar3 = (int *)realloc(vBold->pArray,(ulong)uVar1 << 3);
                    }
                    vBold->pArray = piVar3;
                  }
                  if (piVar3 == (int *)0x0) {
                    __assert_fail("p->pArray",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                                  ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
                  }
                  vBold->nCap = iVar2;
                }
LAB_00226ce8:
                iVar2 = vBold->nSize;
                vBold->nSize = iVar2 + 1;
                vBold->pArray[iVar2] = (int)lVar6;
              }
              lVar6 = lVar6 + 1;
              pGVar4 = pAbc->pGia;
            } while (lVar6 < pGVar4->nObjs);
          }
        }
        else {
          vBold = (Vec_Int_t *)0x0;
        }
        Gia_ManShow(pAbc->pGia,vBold,fAdders);
        if (vBold == (Vec_Int_t *)0x0) {
          return 0;
        }
        if (vBold->pArray != (int *)0x0) {
          free(vBold->pArray);
          vBold->pArray = (int *)0x0;
        }
        free(vBold);
        return 0;
      }
      pcVar5 = "Abc_CommandAbc9Show(): Cannot show GIA with barrier buffers.\n";
    }
    iVar2 = -1;
  }
  else {
    Abc_Print(-2,"usage: &show [-ah]\n");
    Abc_Print(-2,"\t        shows the current GIA using GSView\n");
    pcVar5 = "yes";
    if (fAdders == 0) {
      pcVar5 = "no";
    }
    Abc_Print(-2,"\t-a    : toggle visualazing adders [default = %s]\n",pcVar5);
    pcVar5 = "\t-h    : print the command usage\n";
    iVar2 = -2;
  }
  Abc_Print(iVar2,pcVar5);
  return 1;
}

Assistant:

int Abc_CommandAbc9Show( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Vec_Int_t * vBold = NULL;
    int c, fAdders = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ah" ) ) != EOF )
    {
        switch ( c )
        {
        case 'a':
            fAdders ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Show(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManBufNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9Show(): Cannot show GIA with barrier buffers.\n" );
        return 1;
    }
    if ( !fAdders && Gia_ManHasMapping(pAbc->pGia) )
    {
        vBold = Vec_IntAlloc( 100 );
        Gia_ManForEachLut( pAbc->pGia, c )
            Vec_IntPush( vBold, c );
    }
    Gia_ManShow( pAbc->pGia, vBold, fAdders );
    Vec_IntFreeP( &vBold );
    return 0;

usage:
    Abc_Print( -2, "usage: &show [-ah]\n" );
    Abc_Print( -2, "\t        shows the current GIA using GSView\n" );
    Abc_Print( -2, "\t-a    : toggle visualazing adders [default = %s]\n", fAdders? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}